

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

Descriptor *
google::protobuf::anon_unknown_19::DefaultFinderFindAnyType
          (Message *message,string *prefix,string *name)

{
  bool bVar1;
  Descriptor *this;
  FileDescriptor *this_00;
  DescriptorPool *this_01;
  string *name_local;
  string *prefix_local;
  Message *message_local;
  
  bVar1 = std::operator!=(prefix,"type.googleapis.com/");
  if ((bVar1) && (bVar1 = std::operator!=(prefix,"type.googleprod.com/"), bVar1)) {
    message_local = (Message *)0x0;
  }
  else {
    this = Message::GetDescriptor(message);
    this_00 = Descriptor::file(this);
    this_01 = FileDescriptor::pool(this_00);
    message_local = (Message *)DescriptorPool::FindMessageTypeByName(this_01,name);
  }
  return (Descriptor *)message_local;
}

Assistant:

const Descriptor* DefaultFinderFindAnyType(const Message& message,
                                           const std::string& prefix,
                                           const std::string& name) {
  if (prefix != internal::kTypeGoogleApisComPrefix &&
      prefix != internal::kTypeGoogleProdComPrefix) {
    return nullptr;
  }
  return message.GetDescriptor()->file()->pool()->FindMessageTypeByName(name);
}